

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svd22.c
# Opt level: O3

void svd22(double *A,double *U,double *S,double *V)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double __x;
  double dVar12;
  double dVar14;
  undefined1 auVar13 [16];
  double __x_00;
  double __x_01;
  undefined1 auVar15 [16];
  double dStack_80;
  undefined4 local_78;
  undefined4 uStack_74;
  
  __x_00 = *A + A[3];
  __x = *A - A[3];
  dVar12 = A[1];
  dVar14 = A[2];
  dVar8 = dVar12 + dVar14;
  auVar10._8_4_ = SUB84(dVar8,0);
  auVar10._0_8_ = dVar14 + dVar12;
  auVar10._12_4_ = (int)((ulong)dVar8 >> 0x20);
  dVar3 = atan2(dVar12 - dVar14,__x_00);
  dStack_80 = auVar10._8_8_;
  dVar4 = atan2(dStack_80,__x);
  __x_01 = (dVar3 + dVar4) * 0.5;
  dVar3 = (dVar4 - dVar3) * 0.5;
  dVar4 = cos(__x_01);
  dVar5 = sin(__x_01);
  dVar6 = cos(dVar3);
  dVar7 = sin(dVar3);
  *U = dVar6;
  U[1] = -dVar7;
  U[2] = dVar7;
  U[3] = dVar6;
  *V = dVar4;
  local_78 = SUB84(dVar5,0);
  uStack_74 = (undefined4)((ulong)dVar5 >> 0x20);
  V[1] = -dVar5;
  *(undefined4 *)(V + 2) = local_78;
  *(undefined4 *)((long)V + 0x14) = uStack_74;
  V[3] = dVar4;
  dVar4 = cos(__x_01 - dVar3);
  dVar5 = sin(__x_01 - dVar3);
  dVar6 = cos(dVar3 + __x_01);
  dVar3 = sin(dVar3 + __x_01);
  auVar9._8_8_ = __x;
  auVar9._0_8_ = __x_00;
  auVar15._8_4_ = SUB84(dVar6,0);
  auVar15._0_8_ = dVar4;
  auVar15._12_4_ = (int)((ulong)dVar6 >> 0x20);
  auVar10 = divpd(auVar9,auVar15);
  auVar2._8_8_ = dVar8;
  auVar2._0_8_ = dVar12 - dVar14;
  auVar1._8_8_ = dVar3;
  auVar1._0_8_ = dVar5;
  auVar15 = divpd(auVar2,auVar1);
  dVar12 = (double)(~-(ulong)(ABS(dVar5) < ABS(dVar4)) & auVar15._0_8_ |
                   auVar10._0_8_ & -(ulong)(ABS(dVar5) < ABS(dVar4)));
  dVar14 = (double)(~-(ulong)(ABS(dVar3) < ABS(dVar6)) & auVar15._8_8_ |
                   auVar10._8_8_ & -(ulong)(ABS(dVar3) < ABS(dVar6)));
  dVar8 = (dVar12 + dVar14) * 0.5;
  dVar12 = (dVar12 - dVar14) * 0.5;
  if (dVar8 < 0.0) {
    dVar8 = -dVar8;
    *U = -*U;
    U[2] = -U[2];
  }
  if (dVar12 < 0.0) {
    dVar12 = -dVar12;
    U[1] = -U[1];
    U[3] = -U[3];
  }
  if (dVar8 <= dVar12) {
    *S = dVar12;
    S[1] = dVar8;
    auVar10 = *(undefined1 (*) [16])U;
    auVar15 = *(undefined1 (*) [16])(U + 2);
    auVar11._0_8_ = auVar10._8_8_;
    auVar11._8_4_ = auVar10._0_4_;
    auVar11._12_4_ = auVar10._4_4_;
    *(undefined1 (*) [16])U = auVar11;
    auVar13._0_8_ = auVar15._8_8_;
    auVar13._8_4_ = auVar15._0_4_;
    auVar13._12_4_ = auVar15._4_4_;
    *(undefined1 (*) [16])(U + 2) = auVar13;
    dVar8 = *V;
    dVar12 = V[2];
    *V = V[1];
    V[1] = dVar8;
    V[2] = V[3];
    V[3] = dVar12;
  }
  else {
    *S = dVar8;
    S[1] = dVar12;
  }
  return;
}

Assistant:

void svd22(const double A[4], double U[4], double S[2], double V[4])
{
    double A00 = A[0];
    double A01 = A[1];
    double A10 = A[2];
    double A11 = A[3];

    double B0 = A00 + A11;
    double B1 = A00 - A11;
    double B2 = A01 + A10;
    double B3 = A01 - A10;

    double PminusT = atan2(B3, B0);
    double PplusT = atan2(B2, B1);

    double P = (PminusT + PplusT) / 2;
    double T = (-PminusT + PplusT) / 2;

    double CP = cos(P), SP = sin(P);
    double CT = cos(T), ST = sin(T);

    U[0] = CT;
    U[1] = -ST;
    U[2] = ST;
    U[3] = CT;

    V[0] = CP;
    V[1] = -SP;
    V[2] = SP;
    V[3] = CP;

    // C0 = e+f. There are two ways to compute C0; we pick the one
    // that is better conditioned.
    double CPmT = cos(P-T), SPmT = sin(P-T);
    double C0 = 0;
    if (fabs(CPmT) > fabs(SPmT))
        C0 = B0 / CPmT;
    else
        C0 = B3 / SPmT;

    // C1 = e-f. There are two ways to compute C1; we pick the one
    // that is better conditioned.
    double CPpT = cos(P+T), SPpT = sin(P+T);
    double C1 = 0;
    if (fabs(CPpT) > fabs(SPpT))
        C1 = B1 / CPpT;
    else
        C1 = B2 / SPpT;

    // e and f are the singular values
    double e = (C0 + C1) / 2;
    double f = (C0 - C1) / 2;

    if (e < 0) {
        e = -e;
        U[0] = -U[0];
        U[2] = -U[2];
    }

    if (f < 0) {
        f = -f;
        U[1] = -U[1];
        U[3] = -U[3];
    }

    // sort singular values.
    if (e > f) {
        // already in big-to-small order.
        S[0] = e;
        S[1] = f;
    } else {
        // Curiously, this code never seems to get invoked.  Why is it
        // that S[0] always ends up the dominant vector?  However,
        // this code has been tested (flipping the logic forces us to
        // sort the singular values in ascending order).
        //
        // P = [ 0 1 ; 1 0 ]
        // USV' = (UP)(PSP)(PV')
        //      = (UP)(PSP)(VP)'
        //      = (UP)(PSP)(P'V')'
        S[0] = f;
        S[1] = e;

        // exchange columns of U and V
        double tmp[2];
        tmp[0] = U[0];
        tmp[1] = U[2];
        U[0] = U[1];
        U[2] = U[3];
        U[1] = tmp[0];
        U[3] = tmp[1];

        tmp[0] = V[0];
        tmp[1] = V[2];
        V[0] = V[1];
        V[2] = V[3];
        V[1] = tmp[0];
        V[3] = tmp[1];
    }

    /*
    double SM[4] = { S[0], 0, 0, S[1] };

    doubles_print_mat(U, 2, 2, "%20.10g");
    doubles_print_mat(SM, 2, 2, "%20.10g");
    doubles_print_mat(V, 2, 2, "%20.10g");
    printf("A:\n");
    doubles_print_mat(A, 2, 2, "%20.10g");

    double SVt[4];
    doubles_mat_ABt(SM, 2, 2, V, 2, 2, SVt, 2, 2);
    double USVt[4];
    doubles_mat_AB(U, 2, 2, SVt, 2, 2, USVt, 2, 2);

    printf("USVt\n");
    doubles_print_mat(USVt, 2, 2, "%20.10g");

    double diff[4];
    for (int i = 0; i < 4; i++)
        diff[i] = A[i] - USVt[i];

    printf("diff\n");
    doubles_print_mat(diff, 2, 2, "%20.10g");

    */

}